

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

array_n<float,_1,_std::allocator<float>_> * __thiscall
sisl::array_n<float,_1,_std::allocator<float>_>::operator=
          (array_n<float,_1,_std::allocator<float>_> *this,
          array_n<float,_1,_std::allocator<float>_> *obj)

{
  uint uVar1;
  pointer pfVar2;
  pointer pfVar3;
  float *pfVar4;
  array_n<float,_1,_std::allocator<float>_> local_30;
  
  array_n(&local_30,obj);
  uVar1 = this->_dims[0];
  this->_dims[0] = local_30._dims[0];
  pfVar2 = this->first;
  pfVar3 = this->last;
  this->first = local_30.first;
  this->last = local_30.last;
  pfVar4 = this->_array;
  this->_array = local_30._array;
  if ((pfVar4 != (float *)0x0) && (uVar1 != 0 && pfVar2 != pfVar3)) {
    local_30._array = pfVar4;
    local_30._dims[0] = uVar1;
    local_30.first = pfVar2;
    local_30.last = pfVar3;
    operator_delete(pfVar2);
  }
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }